

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O2

int fffrow(fitsfile *fptr,char *expr,long firstrow,long nrows,long *n_good_rows,char *row_status,
          int *status)

{
  char cVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long local_1e0;
  int naxis;
  ParseData lParse;
  parseInfo Info;
  long naxes [5];
  
  if (*status != 0) {
    return *status;
  }
  memset(&Info,0,0x90);
  iVar2 = ffiprs(fptr,0,expr,5,&Info.datatype,&local_1e0,&naxis,naxes,&lParse,status);
  if (iVar2 == 0) {
    lVar3 = -local_1e0;
    if (0 < local_1e0) {
      lVar3 = local_1e0;
    }
    if ((Info.datatype != 0xe) || (lVar3 != 1)) {
      ffcprs(&lParse);
      ffpmsg("Expression does not evaluate to a logical scalar.");
      *status = 0x1b0;
      return 0x1b0;
    }
    if (local_1e0 < 0) {
      cVar1 = lParse.Nodes[lParse.resultNode].value.data.log;
      *n_good_rows = nrows;
      lVar3 = 0;
      if (nrows < 1) {
        nrows = lVar3;
      }
      for (; nrows != lVar3; lVar3 = lVar3 + 1) {
        row_status[lVar3] = cVar1;
      }
    }
    else {
      lVar3 = 1;
      if (1 < firstrow) {
        lVar3 = firstrow;
      }
      Info.nullPtr = (void *)0x0;
      Info.dataPtr = row_status;
      Info.maxRows = nrows;
      Info.parseData = &lParse;
      iVar2 = ffiter(lParse.nCols,lParse.colData,lVar3 + -1,0,fits_parser_workfn,&Info,status);
      if (iVar2 == -1) {
        *status = 0;
      }
      else if (*status != 0) goto LAB_0011b255;
      *n_good_rows = 0;
      lVar4 = 0;
      lVar3 = Info.maxRows;
      if (Info.maxRows < 1) {
        lVar3 = lVar4;
      }
      for (lVar5 = 0; lVar3 != lVar5; lVar5 = lVar5 + 1) {
        if (row_status[lVar5] == '\x01') {
          lVar4 = lVar4 + 1;
          *n_good_rows = lVar4;
        }
      }
    }
  }
LAB_0011b255:
  ffcprs(&lParse);
  return *status;
}

Assistant:

int fffrow( fitsfile *fptr,         /* I - Input FITS file                   */
            char     *expr,         /* I - Boolean expression                */
            long     firstrow,      /* I - First row of table to eval        */
            long     nrows,         /* I - Number of rows to evaluate        */
            long     *n_good_rows,  /* O - Number of rows eval to True       */
            char     *row_status,   /* O - Array of boolean results          */
            int      *status )      /* O - Error status                      */
/*                                                                           */
/* Evaluate a boolean expression using the indicated rows, returning an      */
/* array of flags indicating which rows evaluated to TRUE/FALSE              */
/*---------------------------------------------------------------------------*/
{
   parseInfo Info;
   int naxis, constant;
   long nelem, naxes[MAXDIMS], elem;
   char result;
   ParseData lParse;

   if( *status ) return( *status );
   memset(&Info, 0, sizeof(Info));   

   if( ffiprs( fptr, 0, expr, MAXDIMS, &Info.datatype, &nelem, &naxis,
               naxes, &lParse, status ) ) {
      ffcprs(&lParse);
      return( *status );
   }
   if( nelem<0 ) {
      constant = 1;
      nelem = -nelem;
   } else
      constant = 0;

   if( Info.datatype!=TLOGICAL || nelem!=1 ) {
      ffcprs(&lParse);
      ffpmsg("Expression does not evaluate to a logical scalar.");
      return( *status = PARSE_BAD_TYPE );
   }

   if( constant ) { /* No need to call parser... have result from ffiprs */
      result = lParse.Nodes[lParse.resultNode].value.data.log;
      *n_good_rows = nrows;
      for( elem=0; elem<nrows; elem++ )
         row_status[elem] = result;
   } else {
      firstrow     = (firstrow>1 ? firstrow : 1);
      Info.dataPtr = row_status;
      Info.nullPtr = NULL;
      Info.maxRows = nrows;
      Info.parseData = &lParse;

      if( ffiter( lParse.nCols, lParse.colData, firstrow-1, 0,
                  fits_parser_workfn, (void*)&Info, status ) == -1 )
         *status = 0;  /* -1 indicates exitted without error before end... OK */

      if( *status ) {

         /***********************/
         /* Error... Do nothing */
         /***********************/

      } else {

         /***********************************/
         /* Count number of good rows found */
         /***********************************/

         *n_good_rows = 0L;
         for( elem=0; elem<Info.maxRows; elem++ ) {
            if( row_status[elem]==1 ) ++*n_good_rows;
         }
      }
   }

   ffcprs(&lParse);
   return(*status);
}